

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O3

void skip_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  jpeg_source_mgr *pjVar1;
  size_t sVar2;
  
  if (0 < num_bytes) {
    pjVar1 = cinfo->src;
    sVar2 = pjVar1->bytes_in_buffer;
    if ((long)sVar2 < num_bytes) {
      do {
        num_bytes = num_bytes - sVar2;
        (*pjVar1->fill_input_buffer)(cinfo);
        sVar2 = pjVar1->bytes_in_buffer;
      } while ((long)sVar2 < num_bytes);
    }
    pjVar1->next_input_byte = pjVar1->next_input_byte + num_bytes;
    pjVar1->bytes_in_buffer = sVar2 - num_bytes;
  }
  return;
}

Assistant:

METHODDEF(void)
skip_input_data(j_decompress_ptr cinfo, long num_bytes)
{
  struct jpeg_source_mgr *src = cinfo->src;

  /* Just a dumb implementation for now.  Could use fseek() except
   * it doesn't work on pipes.  Not clear that being smart is worth
   * any trouble anyway --- large skips are infrequent.
   */
  if (num_bytes > 0) {
    while (num_bytes > (long)src->bytes_in_buffer) {
      num_bytes -= (long)src->bytes_in_buffer;
      (void)(*src->fill_input_buffer) (cinfo);
      /* note we assume that fill_input_buffer will never return FALSE,
       * so suspension need not be handled.
       */
    }
    src->next_input_byte += (size_t)num_bytes;
    src->bytes_in_buffer -= (size_t)num_bytes;
  }
}